

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::binary_go<unsigned_char,unsigned_int>
          (Boxed_Number *this,Opers t_oper,uchar *t,uint *u,Boxed_Value *t_lhs)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uchar uVar3;
  arithmetic_error *this_00;
  bad_any_cast *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Boxed_Value BVar5;
  string local_40;
  
  if (t_oper - assign < 7) {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&switchD_001721a5::switchdataD_00269c3c +
                  (long)(int)(&switchD_001721a5::switchdataD_00269c3c)[t_oper - assign]);
    switch(t_oper) {
    case assign:
      uVar3 = (uchar)*u;
      break;
    default:
      goto switchD_001721a5_caseD_9;
    case assign_product:
      uVar3 = *t * (char)*u;
      break;
    case assign_sum:
      uVar3 = *t + (char)*u;
      break;
    case assign_quotient:
      uVar1 = *u;
      if (uVar1 == 0) {
        this_00 = (arithmetic_error *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        local_40.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
        local_40.field_2._M_allocated_capacity._6_2_ = 0x6220;
        local_40.field_2._8_6_ = 0x6f72657a2079;
        local_40._M_string_length = 0xe;
        local_40.field_2._M_local_buf[0xe] = '\0';
        exception::arithmetic_error::arithmetic_error(this_00,&local_40);
        __cxa_throw(this_00,&exception::arithmetic_error::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      uVar3 = (uchar)((ulong)*t / (ulong)uVar1);
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)*t % (ulong)uVar1);
      break;
    case assign_difference:
      uVar3 = *t - (char)*u;
    }
    *t = uVar3;
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (t_lhs->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (t_lhs->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar5.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
switchD_001721a5_caseD_9:
  this_01 = (bad_any_cast *)__cxa_allocate_exception(0x28);
  detail::exception::bad_any_cast::bad_any_cast(this_01);
  __cxa_throw(this_01,&detail::exception::bad_any_cast::typeinfo,
              detail::exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static Boxed_Value binary_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign:
            t = u;
            break;
          case Operators::assign_product:
            t *= u;
            break;
          case Operators::assign_sum:
            t += u;
            break;
          case Operators::assign_quotient:
            check_divide_by_zero(u);
            t /= u;
            break;
          case Operators::assign_difference:
            t -= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }

        return t_lhs;
      }